

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_cleanup_multiple_channels_in_vector(APITests *this)

{
  runtime_error *this_00;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> channels;
  Warning w;
  allocator_type local_1d9;
  vector<int,_std::allocator<int>_> local_1d8;
  int local_1c0;
  int iStack_1bc;
  long local_1b8;
  long local_1b0 [2];
  Warning local_1a0;
  
  GPIO::setwarnings(false);
  Warning::Warning(&local_1a0);
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::setup((this->pin_data).in_b,IN,-1);
  GPIO::setup((this->pin_data).out_a,OUT,-1);
  local_1c0 = (this->pin_data).in_a;
  iStack_1bc = (this->pin_data).in_b;
  __l._M_len = 2;
  __l._M_array = &local_1c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d8,__l,&local_1d9);
  GPIO::cleanup((vector *)&local_1d8);
  std::__cxx11::stringbuf::str();
  if ((long *)CONCAT44(iStack_1bc,local_1c0) != local_1b0) {
    operator_delete((long *)CONCAT44(iStack_1bc,local_1c0),local_1b0[0] + 1);
  }
  if (local_1b8 == 0) {
    GPIO::cleanup();
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Warning::~Warning(&local_1a0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_cleanup_multiple_channels_in_vector()
    {
        GPIO::setwarnings(false);
        Warning w{};

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_b, GPIO::IN);
        GPIO::setup(pin_data.out_a, GPIO::OUT);

        std::vector<int> channels = {pin_data.in_a, pin_data.in_b};
        GPIO::cleanup(channels);

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");

        GPIO::cleanup();
    }